

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::anon_unknown_24::RetrieveOptionsAssumingRightPool
               (int depth,Message *options,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  FieldDescriptor *this;
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  reference ppFVar4;
  AlphaNum *in_R8;
  string_view pc;
  int local_334;
  int local_31c;
  AlphaNum local_2f8;
  AlphaNum local_2c8;
  AlphaNum local_298;
  string local_268;
  allocator<char> local_241;
  string_view local_240;
  string local_230 [32];
  AlphaNum local_210;
  string_view local_1e0;
  AlphaNum local_1d0;
  AlphaNum local_1a0;
  string local_170;
  undefined1 local_150 [8];
  string name;
  Printer printer;
  string tmp;
  string fieldval;
  int j;
  bool repeated;
  int count;
  FieldDescriptor *field;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  undefined1 local_40 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *option_entries_local;
  Message *options_local;
  int depth_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(option_entries);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Message::GetReflection(options);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_40);
  Reflection::ListFields
            ((Reflection *)
             fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,options,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_40);
  __end2 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_40);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&field);
    if (!bVar1) break;
    ppFVar4 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end2);
    this = *ppFVar4;
    j = 1;
    bVar1 = FieldDescriptor::is_repeated(this);
    if (bVar1) {
      j = Reflection::FieldSize
                    ((Reflection *)
                     fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,options,this);
    }
    for (fieldval.field_2._12_4_ = 0; (int)fieldval.field_2._12_4_ < j;
        fieldval.field_2._12_4_ = fieldval.field_2._12_4_ + 1) {
      std::__cxx11::string::string((string *)(tmp.field_2._M_local_buf + 8));
      CVar3 = FieldDescriptor::cpp_type(this);
      if (CVar3 == CPPTYPE_MESSAGE) {
        std::__cxx11::string::string((string *)&printer.finder_);
        TextFormat::Printer::Printer((Printer *)((long)&name.field_2 + 8));
        TextFormat::Printer::SetExpandAny((Printer *)((long)&name.field_2 + 8),true);
        TextFormat::Printer::SetInitialIndentLevel((Printer *)((long)&name.field_2 + 8),depth + 1);
        if (bVar1) {
          local_31c = fieldval.field_2._12_4_;
        }
        else {
          local_31c = -1;
        }
        in_R8 = (AlphaNum *)&printer.finder_;
        TextFormat::Printer::PrintFieldValueToString
                  ((Printer *)((long)&name.field_2 + 8),options,this,local_31c,(string *)in_R8);
        std::__cxx11::string::append(tmp.field_2._M_local_buf + 8);
        std::__cxx11::string::append((string *)(tmp.field_2._M_local_buf + 8));
        std::__cxx11::string::append((ulong)((long)&tmp.field_2 + 8),(char)depth * '\x02');
        std::__cxx11::string::append(tmp.field_2._M_local_buf + 8);
        TextFormat::Printer::~Printer((Printer *)((long)&name.field_2 + 8));
        std::__cxx11::string::~string((string *)&printer.finder_);
      }
      else {
        if (bVar1) {
          local_334 = fieldval.field_2._12_4_;
        }
        else {
          local_334 = -1;
        }
        TextFormat::PrintFieldValueToString
                  (options,this,local_334,(string *)((long)&tmp.field_2 + 8));
      }
      std::__cxx11::string::string((string *)local_150);
      bVar2 = FieldDescriptor::is_extension(this);
      if (bVar2) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_1a0,"(.");
        pc = FieldDescriptor::full_name(this);
        local_1e0 = pc;
        absl::lts_20250127::AlphaNum::AlphaNum(&local_1d0,pc);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_210,")");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_170,(lts_20250127 *)&local_1a0,&local_1d0,&local_210,in_R8);
        std::__cxx11::string::operator=((string *)local_150,(string *)&local_170);
        std::__cxx11::string::~string((string *)&local_170);
      }
      else {
        local_240 = FieldDescriptor::name(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_230,&local_240,&local_241);
        std::__cxx11::string::operator=((string *)local_150,local_230);
        std::__cxx11::string::~string(local_230);
        std::allocator<char>::~allocator(&local_241);
      }
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_2c8," = ");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tmp.field_2 + 8));
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_268,(lts_20250127 *)&local_298,&local_2c8,&local_2f8,in_R8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(option_entries,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)local_150);
      std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(option_entries);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_40);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool RetrieveOptionsAssumingRightPool(
    int depth, const Message& options,
    std::vector<std::string>* option_entries) {
  option_entries->clear();
  const Reflection* reflection = options.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(options, &fields);
  for (const FieldDescriptor* field : fields) {
    int count = 1;
    bool repeated = false;
    if (field->is_repeated()) {
      count = reflection->FieldSize(options, field);
      repeated = true;
    }
    for (int j = 0; j < count; j++) {
      std::string fieldval;
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        std::string tmp;
        TextFormat::Printer printer;
        printer.SetExpandAny(true);
        printer.SetInitialIndentLevel(depth + 1);
        printer.PrintFieldValueToString(options, field, repeated ? j : -1,
                                        &tmp);
        fieldval.append("{\n");
        fieldval.append(tmp);
        fieldval.append(depth * 2, ' ');
        fieldval.append("}");
      } else {
        TextFormat::PrintFieldValueToString(options, field, repeated ? j : -1,
                                            &fieldval);
      }
      std::string name;
      if (field->is_extension()) {
        name = absl::StrCat("(.", field->full_name(), ")");
      } else {
        name = std::string(field->name());
      }
      option_entries->push_back(absl::StrCat(name, " = ", fieldval));
    }
  }
  return !option_entries->empty();
}